

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O3

Oop __thiscall Lodtalk::CompiledMethod::dump(CompiledMethod *this)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = *(uint *)&this[1].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
                    super_Collection.super_Object.super_ProtoObject.object_header_;
  sVar2 = ProtoObject::getNumberOfElements((ProtoObject *)this);
  dumpSistaBytecode((uint8_t *)
                    ((long)&this[2].super_ByteArray.super_ArrayedCollection.
                            super_SequenceableCollection.super_Collection.super_Object.
                            super_ProtoObject.object_header_ + (ulong)(uVar1 & 0x1fffe) * 4),
                    (sVar2 - ((*(uint *)&this[1].super_ByteArray.super_ArrayedCollection.
                                         super_SequenceableCollection.super_Collection.super_Object.
                                         super_ProtoObject.object_header_ & 0x1fffe) << 2)) - 8);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this;
}

Assistant:

Oop CompiledMethod::dump()
{
    dumpSistaBytecode(getFirstBCPointer(), getByteDataSize());
    return selfOop();
}